

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
CompileLanguageNode::Evaluate
          (string *__return_storage_ptr__,CompileLanguageNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  GeneratorExpressionContent *pGVar1;
  bool bVar2;
  __type _Var3;
  ulong uVar4;
  long lVar5;
  const_reference __rhs;
  char *local_148;
  allocator<char> local_101;
  undefined4 local_100;
  allocator<char> local_f9;
  string local_f8;
  string local_d8;
  string local_b8 [8];
  string genName;
  cmGlobalGenerator *gg;
  allocator<char> local_79;
  string local_78;
  string local_58;
  cmGeneratorExpressionDAGChecker *local_38;
  cmGeneratorExpressionDAGChecker *param_4_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  CompileLanguageNode *this_local;
  
  local_38 = param_4;
  param_4_local = (cmGeneratorExpressionDAGChecker *)content;
  content_local = (GeneratorExpressionContent *)context;
  context_local = (cmGeneratorExpressionContext *)parameters;
  parameters_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (CompileLanguageNode *)__return_storage_ptr__;
  uVar4 = std::__cxx11::string::empty();
  pGVar1 = content_local;
  if ((uVar4 & 1) == 0) {
    genName.field_2._8_8_ =
         cmLocalGenerator::GetGlobalGenerator
                   ((cmLocalGenerator *)
                    content_local[3].ParamChildren.
                    super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    (*((cmGlobalGenerator *)genName.field_2._8_8_)->_vptr_cmGlobalGenerator[3])(local_b8);
    lVar5 = std::__cxx11::string::find((char *)local_b8,0x7b5d6c);
    if ((((lVar5 == -1) &&
         (lVar5 = std::__cxx11::string::find((char *)local_b8,0x7a1436), lVar5 == -1)) &&
        (lVar5 = std::__cxx11::string::find((char *)local_b8,0x79e9c8), lVar5 == -1)) &&
       ((lVar5 = std::__cxx11::string::find((char *)local_b8,0x7b2f8b), lVar5 == -1 &&
        (lVar5 = std::__cxx11::string::find((char *)local_b8,0x7a143c), pGVar1 = content_local,
        lVar5 == -1)))) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                (&local_d8,(GeneratorExpressionContent *)param_4_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"$<COMPILE_LANGUAGE:...> not supported for this generator.",
                 &local_f9);
      reportError((cmGeneratorExpressionContext *)pGVar1,&local_d8,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator(&local_f9);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)context_local);
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,(string *)&content_local[4].IdentifierChildren);
      }
      else {
        pGVar1 = content_local + 4;
        __rhs = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)context_local);
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&pGVar1->IdentifierChildren,__rhs);
        if (_Var3) {
          local_148 = "1";
        }
        else {
          local_148 = "0";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,local_148,&local_101);
        std::allocator<char>::~allocator(&local_101);
      }
    }
    local_100 = 1;
    std::__cxx11::string::~string(local_b8);
    return __return_storage_ptr__;
  }
  GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
            (&local_58,(GeneratorExpressionContent *)param_4_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "$<COMPILE_LANGUAGE:...> may only be used to specify include directories, compile definitions, compile options, and to evaluate components of the file(GENERATE) command."
             ,&local_79);
  reportError((cmGeneratorExpressionContext *)pGVar1,&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    if (context->Language.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<COMPILE_LANGUAGE:...> may only be used to specify include "
        "directories, compile definitions, compile options, and to evaluate "
        "components of the file(GENERATE) command.");
      return std::string();
    }

    cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
    std::string genName = gg->GetName();
    if (genName.find("Makefiles") == std::string::npos &&
        genName.find("Ninja") == std::string::npos &&
        genName.find("Visual Studio") == std::string::npos &&
        genName.find("Xcode") == std::string::npos &&
        genName.find("Watcom WMake") == std::string::npos) {
      reportError(context, content->GetOriginalExpression(),
                  "$<COMPILE_LANGUAGE:...> not supported for this generator.");
      return std::string();
    }
    if (parameters.empty()) {
      return context->Language;
    }
    return context->Language == parameters.front() ? "1" : "0";
  }